

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

void __thiscall llvm::APInt::initFromArray(APInt *this,ArrayRef<unsigned_long> bigVal)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint64_t *__s;
  uint64_t uVar4;
  uint64_t *__src;
  
  __src = bigVal.Data;
  uVar1 = this->BitWidth;
  if ((ulong)uVar1 == 0) {
    __assert_fail("BitWidth && \"Bitwidth too small\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x5b,"void llvm::APInt::initFromArray(ArrayRef<uint64_t>)");
  }
  if (__src != (uint64_t *)0x0) {
    if (uVar1 < 0x41) {
      if (bigVal.Length == 0) {
        __assert_fail("Index < Length && \"Invalid index!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/ArrayRef.h"
                      ,0xf1,
                      "const T &llvm::ArrayRef<unsigned long>::operator[](size_t) const [T = unsigned long]"
                     );
      }
      uVar4 = *__src;
      (this->U).VAL = uVar4;
    }
    else {
      uVar2 = (uint)((ulong)uVar1 + 0x3f >> 6);
      __s = (uint64_t *)operator_new__((ulong)(uVar2 * 8));
      memset(__s,0,(ulong)(uVar2 * 8));
      (this->U).pVal = __s;
      uVar3 = (uint)bigVal.Length;
      if (uVar2 < (uint)bigVal.Length) {
        uVar3 = uVar2;
      }
      memcpy(__s,__src,(ulong)(uVar3 << 3));
      this = (APInt *)(__s + (uVar2 - 1));
      uVar4 = (this->U).VAL;
    }
    (this->U).VAL = (uVar4 << (-(char)uVar1 & 0x3fU)) >> (-(char)uVar1 & 0x3fU);
    return;
  }
  __assert_fail("bigVal.data() && \"Null pointer detected!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x5c,"void llvm::APInt::initFromArray(ArrayRef<uint64_t>)");
}

Assistant:

void APInt::initFromArray(ArrayRef<uint64_t> bigVal) {
  assert(BitWidth && "Bitwidth too small");
  assert(bigVal.data() && "Null pointer detected!");
  if (isSingleWord())
    U.VAL = bigVal[0];
  else {
    // Get memory, cleared to 0
    U.pVal = getClearedMemory(getNumWords());
    // Calculate the number of words to copy
    unsigned words = std::min<unsigned>(bigVal.size(), getNumWords());
    // Copy the words from bigVal to pVal
    memcpy(U.pVal, bigVal.data(), words * APINT_WORD_SIZE);
  }
  // Make sure unused high bits are cleared
  clearUnusedBits();
}